

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O1

void __thiscall CVmObjGramProd::delete_alt_undo(CVmObjGramProd *this,vm_obj_id_t self,int idx)

{
  vmgram_alt_info *pvVar1;
  int iVar2;
  vmgram_undo_rec *this_00;
  vm_val_t local_38;
  
  this_00 = (vmgram_undo_rec *)operator_new(0x10);
  pvVar1 = *(vmgram_alt_info **)(*(long *)((this->super_CVmObject).ext_ + 0x30) + (long)idx * 8);
  this_00->idx = idx;
  this_00->op = 1;
  this_00->alt = pvVar1;
  local_38.typ = VM_NIL;
  iVar2 = CVmUndo::add_new_record_ptr_key(G_undo_X,self,this_00,&local_38);
  if (iVar2 == 0) {
    vmgram_undo_rec::~vmgram_undo_rec(this_00);
    operator_delete(this_00,0x10);
  }
  delete_alt(this,(long)idx);
  return;
}

Assistant:

void CVmObjGramProd::delete_alt_undo(VMG_ vm_obj_id_t self, int idx)

{
    /* create an undo record for deleting this item */
    vmgram_undo_rec *rec = new vmgram_undo_rec(
        VMGRAM_UNDO_DELETED, idx, get_ext()->alts_[idx]);

    /* save the record */
    if (!G_undo->add_new_record_ptr_key(vmg_ self, rec))
        delete rec;
    
    /* remove the alternative from the array */
    delete_alt(idx);
}